

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

void __thiscall trackerboy::apu::Hardware::reset(Hardware *this)

{
  _Mem_fn<void_(trackerboy::apu::LengthCounter::*)()_noexcept> __f;
  _Mem_fn<void_(trackerboy::apu::Envelope::*)()_noexcept> __f_00;
  iterator __return_storage_ptr__;
  iterator __first;
  iterator __return_storage_ptr___00;
  iterator __first_00;
  __tuple_element_t<0UL,_tuple<PulseChannel,_PulseChannel,_WaveChannel,_NoiseChannel>_> *this_00;
  __tuple_element_t<1UL,_tuple<PulseChannel,_PulseChannel,_WaveChannel,_NoiseChannel>_> *this_01;
  __tuple_element_t<2UL,_tuple<PulseChannel,_PulseChannel,_WaveChannel,_NoiseChannel>_> *this_02;
  __tuple_element_t<3UL,_tuple<PulseChannel,_PulseChannel,_WaveChannel,_NoiseChannel>_> *this_03;
  value_type_conflict2 local_75;
  value_type local_74;
  _Mem_fn<void_(trackerboy::apu::Envelope::*)()_noexcept> *local_70;
  code *local_60;
  undefined8 local_58;
  Envelope *local_50;
  _Mem_fn<void_(trackerboy::apu::LengthCounter::*)()_noexcept> *local_40;
  code *local_30;
  undefined8 local_28;
  LengthCounter *local_20;
  Hardware *local_10;
  Hardware *this_local;
  
  local_10 = this;
  __return_storage_ptr__ =
       std::array<trackerboy::apu::LengthCounter,_4UL>::begin(&this->mLengthCounters);
  __first = std::array<trackerboy::apu::LengthCounter,_4UL>::end(&this->mLengthCounters);
  local_30 = LengthCounter::reset;
  local_28 = 0;
  local_20 = (LengthCounter *)
             std::mem_fn<void()noexcept,trackerboy::apu::LengthCounter>
                       ((_Mem_fn<void_(trackerboy::apu::LengthCounter::*)()_noexcept> *)
                        LengthCounter::reset,0);
  __f.super__Mem_fn_base<void_(trackerboy::apu::LengthCounter::*)()_noexcept,_true>._8_8_ = __first;
  __f.super__Mem_fn_base<void_(trackerboy::apu::LengthCounter::*)()_noexcept,_true>._M_pmf =
       (offset_in_LengthCounter_to_subr)__return_storage_ptr__;
  local_40 = std::
             for_each<trackerboy::apu::LengthCounter*,std::_Mem_fn<void(trackerboy::apu::LengthCounter::*)()noexcept>>
                       ((_Mem_fn<void_(trackerboy::apu::LengthCounter::*)()_noexcept> *)
                        __return_storage_ptr__,__first,local_20,__f);
  __return_storage_ptr___00 = std::array<trackerboy::apu::Envelope,_3UL>::begin(&this->mEnvelopes);
  __first_00 = std::array<trackerboy::apu::Envelope,_3UL>::end(&this->mEnvelopes);
  local_60 = Envelope::reset;
  local_58 = 0;
  local_50 = (Envelope *)
             std::mem_fn<void()noexcept,trackerboy::apu::Envelope>
                       ((_Mem_fn<void_(trackerboy::apu::Envelope::*)()_noexcept> *)Envelope::reset,0
                       );
  __f_00.super__Mem_fn_base<void_(trackerboy::apu::Envelope::*)()_noexcept,_true>._8_8_ = __first;
  __f_00.super__Mem_fn_base<void_(trackerboy::apu::Envelope::*)()_noexcept,_true>._M_pmf =
       (offset_in_Envelope_to_subr)__return_storage_ptr__;
  local_70 = std::
             for_each<trackerboy::apu::Envelope*,std::_Mem_fn<void(trackerboy::apu::Envelope::*)()noexcept>>
                       ((_Mem_fn<void_(trackerboy::apu::Envelope::*)()_noexcept> *)
                        __return_storage_ptr___00,__first_00,local_50,__f_00);
  Sweep::reset(&this->mSweep);
  Sequencer::reset(&this->mSequencer);
  this_00 = std::
            get<0ul,trackerboy::apu::PulseChannel,trackerboy::apu::PulseChannel,trackerboy::apu::WaveChannel,trackerboy::apu::NoiseChannel>
                      (&this->mChannels);
  PulseChannel::reset(this_00);
  this_01 = std::
            get<1ul,trackerboy::apu::PulseChannel,trackerboy::apu::PulseChannel,trackerboy::apu::WaveChannel,trackerboy::apu::NoiseChannel>
                      (&this->mChannels);
  PulseChannel::reset(this_01);
  this_02 = std::
            get<2ul,trackerboy::apu::PulseChannel,trackerboy::apu::PulseChannel,trackerboy::apu::WaveChannel,trackerboy::apu::NoiseChannel>
                      (&this->mChannels);
  WaveChannel::reset(this_02);
  this_03 = std::
            get<3ul,trackerboy::apu::PulseChannel,trackerboy::apu::PulseChannel,trackerboy::apu::WaveChannel,trackerboy::apu::NoiseChannel>
                      (&this->mChannels);
  NoiseChannel::reset(this_03);
  local_74 = mute;
  std::array<trackerboy::apu::MixMode,_4UL>::fill(&this->mMix,&local_74);
  local_75 = '\0';
  std::array<unsigned_char,_4UL>::fill(&this->mLastOutputs,&local_75);
  return;
}

Assistant:

void Hardware::reset() {
    std::for_each(mLengthCounters.begin(), mLengthCounters.end(), std::mem_fn(&LengthCounter::reset));
    std::for_each(mEnvelopes.begin(), mEnvelopes.end(), std::mem_fn(&Envelope::reset));
    mSweep.reset();
    mSequencer.reset();
    std::get<0>(mChannels).reset();
    std::get<1>(mChannels).reset();
    std::get<2>(mChannels).reset();
    std::get<3>(mChannels).reset();

    mMix.fill(MixMode::mute);
    mLastOutputs.fill((uint8_t)0);
}